

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

void pzshape::TPZShapeTetra::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  ostream *this;
  void *this_00;
  TPZFMatrix<double> *in_RCX;
  int in_EDX;
  TPZVec<double> *in_RSI;
  int in_EDI;
  TPZFMatrix<double> *in_R8;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZFMatrix<double> *in_stack_00000cc8;
  TPZFMatrix<double> *in_stack_00000cd0;
  int in_stack_00000cdc;
  TPZVec<double> *in_stack_00000ce0;
  TPZFMatrix<double> *in_stack_00001758;
  TPZFMatrix<double> *in_stack_00001760;
  int in_stack_0000176c;
  TPZVec<double> *in_stack_00001770;
  
  if ((in_EDI < 4) || (0xe < in_EDI)) {
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  if (in_EDI - 4U < 6) {
    TPZShapeLinear::ShapeInternal(in_RSI,in_EDX,in_RCX,in_R8);
  }
  else if (in_EDI - 10U < 4) {
    TPZShapeTriang::ShapeInternal
              (in_stack_00000ce0,in_stack_00000cdc,in_stack_00000cd0,in_stack_00000cc8);
  }
  else if (in_EDI == 0xe) {
    ShapeInternal(in_stack_00001770,in_stack_0000176c,in_stack_00001760,in_stack_00001758);
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"Wrong side parameter side ");
    this_00 = (void *)std::ostream::operator<<(this,in_EDI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  return;
}

Assistant:

void TPZShapeTetra::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                      TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi){
        if (side < 4 || side > 14) {
            DebugStop();
        }
        
        switch (side) {
                
            case 4:
            case 5:
            case 6:
            case 7:
            case 8:
            case 9:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            case 10:
            case 11:
            case 12:
            case 13:
                
            {
                pzshape::TPZShapeTriang::ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            case 14:
            {

               ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            default:
                std::cout << "Wrong side parameter side " << side << std::endl;
                DebugStop();
                break;
        }

    }